

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cpp
# Opt level: O0

int __thiscall Epoll::Epoll_Add(Epoll *this,SP_channel *_channel,bool accept_flag)

{
  int __epfd;
  int __fd;
  element_type *peVar1;
  size_type sVar2;
  ostream *this_00;
  mapped_type *this_01;
  int flag;
  epoll_event epevent;
  bool accept_flag_local;
  SP_channel *_channel_local;
  Epoll *this_local;
  
  peVar1 = std::__shared_ptr_access<channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      _channel);
  sVar2 = std::
          unordered_map<int,_std::shared_ptr<channel>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<channel>_>_>_>
          ::count(&this->Mmap,&peVar1->fd);
  if (sVar2 == 0) {
    peVar1 = std::__shared_ptr_access<channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        _channel);
    this_01 = std::
              unordered_map<int,_std::shared_ptr<channel>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<channel>_>_>_>
              ::operator[](&this->Mmap,&peVar1->fd);
    std::shared_ptr<channel>::operator=(this_01,_channel);
    if (accept_flag) {
      peVar1 = std::__shared_ptr_access<channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          _channel);
      peVar1->accept_epoll = this;
    }
    else {
      peVar1 = std::__shared_ptr_access<channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          _channel);
      peVar1->attach_epoll = this;
    }
    __epfd = this->epfd;
    peVar1 = std::__shared_ptr_access<channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        _channel);
    __fd = peVar1->fd;
    peVar1 = std::__shared_ptr_access<channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        _channel);
    epoll_ctl(__epfd,1,__fd,(epoll_event *)&peVar1->epevent);
    this_local._4_4_ = 0;
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cout,"the fd is in the epoll list!,Add fail");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int Epoll::Epoll_Add(SP_channel _channel,bool accept_flag)
{
    if(Mmap.count(_channel->fd) != 0)
    {
        cout<<"the fd is in the epoll list!,Add fail"<<endl;
        return -1;
    }
    Mmap[_channel->fd] = _channel;
    epoll_event epevent;
    if(accept_flag)
        _channel->accept_epoll = this;
    else
        _channel->attach_epoll = this;
    int flag = epoll_ctl(epfd,EPOLL_CTL_ADD,_channel->fd,&_channel->epevent);
    //cout<<"add fd "<< _channel->fd <<" success!"<<endl;
    return 0;
}